

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool array_bitset_container_xor
                (array_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint16_t *puVar4;
  ulong uVar5;
  bitset_container_t *bits;
  array_container_t *paVar6;
  long lVar7;
  int32_t iVar8;
  
  bits = bitset_container_create();
  bits->cardinality = src_2->cardinality;
  memcpy(bits->words,src_2->words,0x2000);
  iVar8 = bits->cardinality;
  iVar2 = src_1->cardinality;
  if ((long)iVar2 != 0) {
    puVar3 = bits->words;
    puVar4 = src_1->array;
    lVar7 = 0;
    do {
      uVar1 = *(ushort *)((long)puVar4 + lVar7);
      uVar5 = puVar3[uVar1 >> 6];
      iVar8 = (iVar8 - ((int)(uVar5 >> ((byte)uVar1 & 0x3f)) * 2 & 2U)) + 1;
      puVar3[uVar1 >> 6] = uVar5 ^ 1L << ((ulong)uVar1 & 0x3f);
      lVar7 = lVar7 + 2;
    } while ((long)iVar2 * 2 != lVar7);
  }
  bits->cardinality = iVar8;
  if (iVar8 < 0x1001) {
    paVar6 = array_container_from_bitset(bits);
    *dst = paVar6;
    bitset_container_free(bits);
  }
  else {
    *dst = bits;
  }
  return 0x1000 < iVar8;
}

Assistant:

bool array_bitset_container_xor(
    const array_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    bitset_container_t *result = bitset_container_create();
    bitset_container_copy(src_2, result);
    result->cardinality = (int32_t)bitset_flip_list_withcard(
        result->words, result->cardinality, src_1->array, src_1->cardinality);

    // do required type conversions.
    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}